

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

Expr exec_eval(pExecutor exec,pContext_conflict context,Expr expr)

{
  _Bool _Var1;
  int iVar2;
  Expr *__ptr;
  Expr EVar3;
  Expr EVar4;
  Expr expr_00;
  Expr expr_01;
  Expr func;
  Expr *list;
  pContext_conflict pCStack_38;
  int len;
  pContext_conflict context_local;
  pExecutor exec_local;
  Expr expr_local;
  Expr result;
  
  expr_local._0_8_ = expr.field_1;
  exec_local._0_4_ = expr.type;
  pCStack_38 = context;
  context_local = (pContext_conflict)exec;
  if ((ValueType)exec_local == VT_ATOM) {
    iVar2 = context_get(context,expr_local._0_8_,(Expr *)&expr_local.field_1);
    if (iVar2 == -1) {
      printf("eval: atom \"%s\" not binded\n",
             *(undefined8 *)(*(long *)(context_local + 2) + expr_local._0_8_ * 8));
      exit(1);
    }
  }
  else if ((ValueType)exec_local == VT_PAIR) {
    expr_01.field_1.val_atom = expr_local._0_8_;
    expr_01._0_8_ = 2;
    __ptr = get_list(exec,expr_01,(int *)((long)&list + 4));
    EVar3._4_4_ = 0;
    EVar3.type = __ptr->type;
    EVar3.field_1.val_atom = (__ptr->field_1).val_atom;
    EVar3 = get_function((pExecutor)context_local,pCStack_38,EVar3);
    expr_00._4_4_ = 0;
    expr_00.type = EVar3.type;
    expr_00.field_1.val_atom = EVar3.field_1.val_atom;
    _Var1 = is_none(expr_00);
    if (_Var1) {
      printf("eval: list head not a function or registered macro\n");
      exit(1);
    }
    EVar3 = exec_function((pExecutor)context_local,pCStack_38,EVar3.field_1.val_func,__ptr + 1,
                          list._4_4_ + -1);
    result._0_8_ = EVar3.field_1;
    expr_local.field_1.val_atom._0_4_ = EVar3.type;
    free(__ptr);
  }
  else {
    expr_local.field_1.val_atom._4_4_ = 0;
    expr_local.field_1.val_atom._0_4_ = (ValueType)exec_local;
    result._0_8_ = expr_local._0_8_;
  }
  EVar4._0_8_ = expr_local.field_1.val_atom & 0xffffffff;
  EVar4.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)result._0_8_;
  return EVar4;
}

Assistant:

Expr exec_eval(pExecutor exec, pContext context, Expr expr)
{
    if (expr.type == VT_ATOM)
    {
        Expr value;
        if (context_get(context, expr.val_atom, &value) == MAP_FAILED)
        {
            logf("eval: atom \"%s\" not binded", exec->atoms[expr.val_atom]);
            exit(1);
        }
        return value;
    }
    else if (expr.type != VT_PAIR)
    {
        return expr;
    }

    int len;
    Expr *list = get_list(exec, expr, &len);

    Expr func = get_function(exec, context, list[0]);
    if (is_none(func))
    {
        log("eval: list head not a function or registered macro");
        // TODO: print debug information
        exit(1);
    }
    Expr result = exec_function(exec, context, func.val_func, list + 1, len - 1);
    free(list);
    return result;
}